

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O3

sexp_conflict
sexp_utf8_ref(sexp_conflict ctx,sexp_conflict self,sexp_conflict bv,sexp_conflict offset)

{
  byte bVar1;
  uint uVar2;
  sexp_conflict psVar3;
  long lVar4;
  uint uVar5;
  
  if ((((ulong)bv & 3) != 0) || (bv->tag != 8)) {
    psVar3 = (sexp_conflict)sexp_type_exception(ctx,self,8,bv);
    return psVar3;
  }
  if (((ulong)offset & 1) == 0) {
    psVar3 = (sexp_conflict)sexp_type_exception(ctx,self,2);
    return psVar3;
  }
  lVar4 = (long)offset >> 1;
  bVar1 = (bv->value).flonum_bits[lVar4 + 8];
  if (-1 < (long)(char)bVar1) {
    return (sexp_conflict)((long)(char)bVar1 << 8 | 0x1e);
  }
  if ((byte)(bVar1 + 8) < 200) {
    psVar3 = (sexp_conflict)sexp_user_exception(ctx,0,"utf8-ref: invalid utf8 byte");
    return psVar3;
  }
  if (bVar1 < 0xe0) {
    uVar2 = (byte)(bv->value).flonum_bits[lVar4 + 9] & 0x3f | (bVar1 & 0x3f) << 6;
  }
  else {
    uVar2 = (byte)(bv->value).flonum_bits[lVar4 + 9] & 0x3f;
    uVar5 = (byte)(bv->value).flonum_bits[lVar4 + 10] & 0x3f;
    if (bVar1 < 0xf0) {
      return (sexp_conflict)(ulong)((uVar2 << 6 | (bVar1 & 0x1f) << 0xc | uVar5) << 8 | 0x1e);
    }
    uVar2 = (byte)(bv->value).flonum_bits[lVar4 + 0xb] & 0x3f |
            uVar5 << 6 | uVar2 << 0xc | (bVar1 & 0xf) << 0x12;
  }
  return (sexp_conflict)(ulong)(uVar2 << 8 | 0x1e);
}

Assistant:

sexp sexp_utf8_ref (sexp ctx, sexp self, sexp bv, sexp offset) {
  sexp_assert_type(ctx, sexp_bytesp, SEXP_BYTES, bv);
  sexp_assert_type(ctx, sexp_fixnump, SEXP_FIXNUM, offset);
  unsigned char *p=(unsigned char*)sexp_bytes_data(bv) + sexp_unbox_fixnum(offset);
  if (*p < 0x80)
    return sexp_make_character(*p);
  else if ((*p < 0xC0) || (*p > 0xF7))
    return sexp_user_exception(ctx, NULL, "utf8-ref: invalid utf8 byte", offset);
  else if (*p < 0xE0)
    return sexp_make_character(((p[0]&0x3F)<<6) + (p[1]&0x3F));
  else if (*p < 0xF0)
    return sexp_make_character(((p[0]&0x1F)<<12) + ((p[1]&0x3F)<<6) + (p[2]&0x3F));
  else
    return sexp_make_character(((p[0]&0x0F)<<18) + ((p[1]&0x3F)<<12) + ((p[2]&0x3F)<<6) + (p[3]&0x3F));
}